

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O1

int __thiscall
EnvironmentNAVXYTHETALAT::GetGoalHeuristic(EnvironmentNAVXYTHETALAT *this,int stateID)

{
  uint uVar1;
  uint uVar2;
  SBPL2DGridSearch *pSVar3;
  EnvNAVXYTHETALATHashEntry_t *pEVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  double extraout_XMM0_Qa;
  
  pSVar3 = (this->super_EnvironmentNAVXYTHETALATTICE).grid2Dsearchfromgoal;
  pEVar4 = (this->StateID2CoordTable).
           super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
           ._M_impl.super__Vector_impl_data._M_start[stateID];
  uVar1 = pEVar4->X;
  uVar2 = pEVar4->Y;
  iVar8 = (int)uVar1 / pSVar3->downsample_;
  iVar6 = (int)uVar2 / pSVar3->downsample_;
  if (pSVar3->term_condition_usedlast == SBPL_2DGRIDSEARCH_TERM_CONDITION_OPTPATHFOUND) {
    uVar9 = iVar8 - pSVar3->goalX_;
    uVar5 = -uVar9;
    if (0 < (int)uVar9) {
      uVar5 = uVar9;
    }
    uVar10 = iVar6 - pSVar3->goalY_;
    uVar9 = -uVar10;
    if (0 < (int)uVar10) {
      uVar9 = uVar10;
    }
    if (uVar9 < uVar5) {
      uVar9 = uVar5;
    }
    iVar7 = (int)((float)(int)uVar9 * pSVar3->cellSize_m_ * 1000.0);
    if (((pSVar3->searchStates2D_[iVar8][iVar6].iterationaccessed != pSVar3->iteration_) ||
        (iVar6 = pSVar3->searchStates2D_[iVar8][iVar6].g,
        pSVar3->largestcomputedoptf_ < iVar6 + iVar7)) &&
       (iVar6 = pSVar3->largestcomputedoptf_ - iVar7, 999999999 < pSVar3->largestcomputedoptf_)) {
      iVar6 = 1000000000;
    }
  }
  else if ((pSVar3->searchStates2D_[iVar8][iVar6].iterationaccessed != pSVar3->iteration_) ||
          (iVar6 = pSVar3->searchStates2D_[iVar8][iVar6].g, pSVar3->largestcomputedoptf_ < iVar6)) {
    iVar6 = pSVar3->largestcomputedoptf_;
  }
  (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
    _vptr_DiscreteSpaceInformation[0x4a])
            (this,(ulong)uVar1,(ulong)uVar2,
             (ulong)(uint)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.EndX_c,
             (ulong)(uint)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.EndY_c);
  iVar8 = (int)(extraout_XMM0_Qa * 1000.0);
  if ((int)(extraout_XMM0_Qa * 1000.0) < iVar6) {
    iVar8 = iVar6;
  }
  return (int)((double)iVar8 /
              (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.nominalvel_mpersecs);
}

Assistant:

int EnvironmentNAVXYTHETALAT::GetGoalHeuristic(int stateID)
{
#if USE_HEUR==0
    return 0;
#endif

#if DEBUG
    if (stateID >= (int)StateID2CoordTable.size()) {
        throw SBPL_Exception("ERROR in EnvNAVXYTHETALAT... function: stateID illegal");
    }
#endif

    EnvNAVXYTHETALATHashEntry_t* HashEntry = StateID2CoordTable[stateID];
    // computes distances from start state that is grid2D, so it is EndX_c EndY_c
    int h2D = grid2Dsearchfromgoal->getlowerboundoncostfromstart_inmm(HashEntry->X, HashEntry->Y);
    int hEuclid = (int)(NAVXYTHETALAT_COSTMULT_MTOMM *
            EuclideanDistance_m(HashEntry->X, HashEntry->Y, EnvNAVXYTHETALATCfg.EndX_c, EnvNAVXYTHETALATCfg.EndY_c));

    // define this function if it is used in the planner (heuristic backward search would use it)
    return (int)(((double)__max(h2D, hEuclid)) / EnvNAVXYTHETALATCfg.nominalvel_mpersecs);
}